

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

bool wabt::anon_unknown_1::IsInstr(TokenTypePair pair)

{
  bool bVar1;
  byte bVar2;
  TokenType token_type;
  uint uVar3;
  
  token_type = pair._M_elems[0];
  bVar1 = IsPlainInstr(token_type);
  bVar2 = 1;
  if ((bVar1) ||
     ((token_type - Block < 0x3d &&
      ((0x1800000008400001U >> ((ulong)(token_type - Block) & 0x3f) & 1) != 0)))) goto LAB_0015db22;
  if (token_type == Lpar) {
    bVar1 = IsPlainInstr(pair._M_elems[1]);
    if (bVar1) goto LAB_0015db22;
    uVar3 = pair._M_elems[1] - Block;
    if (uVar3 < 0x3d) {
      bVar2 = (byte)(0x1800000008400001 >> ((byte)uVar3 & 0x3f));
      goto LAB_0015db22;
    }
  }
  bVar2 = 0;
LAB_0015db22:
  return (bool)(bVar2 & 1);
}

Assistant:

bool IsInstr(TokenTypePair pair) {
  return IsPlainOrBlockInstr(pair[0]) || IsExpr(pair);
}